

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O3

QList<QPersistentModelIndex> *
qSelectionIndexes<QList<QPersistentModelIndex>>
          (QList<QPersistentModelIndex> *__return_storage_ptr__,QItemSelection *selection)

{
  QList<QItemSelectionRange> *pQVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  QAbstractItemModel *pQVar6;
  long in_RDX;
  uint uVar7;
  uint uVar8;
  long in_FS_OFFSET;
  QPersistentModelIndex local_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_88;
  undefined8 local_78;
  undefined1 *puStack_70;
  QAbstractItemModel *local_68;
  undefined8 local_58;
  undefined1 *puStack_50;
  QAbstractItemModel *local_48;
  QList<QPersistentModelIndex> *local_38;
  
  local_38 = *(QList<QPersistentModelIndex> **)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QPersistentModelIndex *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (in_RDX != 0) {
    pQVar1 = &selection->super_QList<QItemSelectionRange>;
    do {
      bVar2 = QItemSelectionRange::isValid((QItemSelectionRange *)selection);
      if ((bVar2) &&
         (pQVar6 = QPersistentModelIndex::model((QPersistentModelIndex *)selection),
         pQVar6 != (QAbstractItemModel *)0x0)) {
        local_48 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::operator_cast_to_QModelIndex((QPersistentModelIndex *)selection);
        uVar3 = QPersistentModelIndex::row(&((QItemSelectionRange *)selection)->br);
        iVar4 = QPersistentModelIndex::column(&((QItemSelectionRange *)selection)->br);
        if ((int)(uint)local_58 <= (int)uVar3) {
          uVar8 = (uint)local_58;
          do {
            local_68 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            local_78 = &DAT_aaaaaaaaaaaaaaaa;
            puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
            if (local_48 == (QAbstractItemModel *)0x0) {
              local_78 = (undefined1 *)0xffffffffffffffff;
              puStack_70 = (undefined1 *)0x0;
              local_68 = (QAbstractItemModel *)0x0;
            }
            else if ((uint)local_58 == uVar8) {
              local_68 = local_48;
              local_78 = local_58;
              puStack_70 = puStack_50;
            }
            else {
              (*(local_48->super_QObject)._vptr_QObject[0xe])
                        (&local_78,local_48,(ulong)uVar8,(ulong)local_58._4_4_,&local_58);
            }
            uVar7 = local_58._4_4_;
            if ((int)local_58._4_4_ <= iVar4) {
              do {
                local_88.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
                local_98 = &DAT_aaaaaaaaaaaaaaaa;
                puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
                if (local_68 == (QAbstractItemModel *)0x0) {
                  local_98 = (undefined1 *)0xffffffffffffffff;
                  puStack_90 = (undefined1 *)0x0;
                  local_88.ptr = (QAbstractItemModel *)0x0;
                }
                else if (((uint)local_78 == uVar8) && (uVar7 == local_78._4_4_)) {
                  local_88.ptr = local_68;
                  local_98 = local_78;
                  puStack_90 = puStack_70;
                }
                else {
                  (*(local_68->super_QObject)._vptr_QObject[0xe])
                            ((QModelIndex *)&local_98,local_68,(ulong)uVar8,(ulong)uVar7,&local_78);
                }
                pQVar6 = QPersistentModelIndex::model((QPersistentModelIndex *)selection);
                uVar5 = (*(pQVar6->super_QObject)._vptr_QObject[0x27])
                                  (pQVar6,(QModelIndex *)&local_98);
                if ((~uVar5 & 0x21) == 0) {
                  QPersistentModelIndex::QPersistentModelIndex(&local_a0,(QModelIndex *)&local_98);
                  QtPrivate::QMovableArrayOps<QPersistentModelIndex>::emplace<QPersistentModelIndex>
                            ((QMovableArrayOps<QPersistentModelIndex> *)__return_storage_ptr__,
                             (__return_storage_ptr__->d).size,&local_a0);
                  QList<QPersistentModelIndex>::end(__return_storage_ptr__);
                  QPersistentModelIndex::~QPersistentModelIndex(&local_a0);
                }
                uVar7 = uVar7 + 1;
              } while (iVar4 + 1U != uVar7);
            }
            bVar2 = uVar8 != uVar3;
            uVar8 = uVar8 + 1;
          } while (bVar2);
        }
      }
      selection = (QItemSelection *)((long)selection + 0x10);
    } while ((QItemSelectionRange *)selection !=
             (QItemSelectionRange *)(&(pQVar1->d).d + in_RDX * 2));
  }
  if (*(QList<QPersistentModelIndex> **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(QList<QPersistentModelIndex> **)(in_FS_OFFSET + 0x28);
}

Assistant:

static ModelIndexContainer qSelectionIndexes(const QItemSelection &selection)
{
    ModelIndexContainer result;
    for (const auto &range : selection)
        indexesFromRange(range, result);
    return result;
}